

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError BoostPriority(PaUnixThread *self)

{
  int iVar1;
  int *piVar2;
  pthread_t *in_RDI;
  sched_param spm;
  PaError result;
  sched_param local_10;
  PaError local_c;
  pthread_t *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  memset(&local_10,0,4);
  local_10.__sched_priority = 1;
  iVar1 = pthread_setschedparam(*local_8,1,&local_10);
  if (iVar1 == 0) {
    local_c = 1;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 1) {
      local_c = 0;
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'errno == EPERM\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 256\n"
                       );
      local_c = -0x2702;
    }
  }
  return local_c;
}

Assistant:

static PaError BoostPriority( PaUnixThread* self )
{
    PaError result = paNoError;
    struct sched_param spm = { 0 };
    /* Priority should only matter between contending FIFO threads? */
    spm.sched_priority = 1;

    assert( self );

    if( pthread_setschedparam( self->thread, SCHED_FIFO, &spm ) != 0 )
    {
        PA_UNLESS( errno == EPERM, paInternalError );  /* Lack permission to raise priority */
        PA_DEBUG(( "Failed bumping priority\n" ));
        result = 0;
    }
    else
    {
        result = 1; /* Success */
    }
error:
    return result;
}